

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerApp.cpp
# Opt level: O3

string * __thiscall
helics::BrokerApp::query_abi_cxx11_
          (string *__return_storage_ptr__,BrokerApp *this,string_view target,string_view queryStr,
          HelicsSequencingModes mode)

{
  element_type *peVar1;
  
  peVar1 = (this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"#error","",target._M_str,queryStr._M_len,
               queryStr._M_str);
  }
  else {
    (*peVar1->_vptr_Broker[0x11])(__return_storage_ptr__,peVar1,target._M_len);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
    BrokerApp::query(std::string_view target, std::string_view queryStr, HelicsSequencingModes mode)
{
    return (broker) ? broker->query(target, queryStr, mode) : std::string("#error");
}